

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Dequantize_x86::forward(Dequantize_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int elemcount;
  bool bVar17;
  int local_d8;
  Mat local_d0;
  Mat local_88;
  Mat *local_40;
  Mat *local_38;
  
  elempack = bottom_blob->elempack;
  iVar1 = bottom_blob->dims;
  elemcount = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar15 = (ulong)uVar2;
  uVar3 = bottom_blob->c;
  local_40 = bottom_blob;
  Mat::create_like(top_blob,bottom_blob,opt->blob_allocator);
  local_d8 = -100;
  if (top_blob->data != (void *)0x0) {
    if ((long)top_blob->c * top_blob->cstep != 0) {
      sVar10 = (size_t)elempack;
      if (iVar1 == 3) {
        local_d8 = 0;
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        lVar11 = 0;
        for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
          sVar4 = local_40->cstep;
          sVar6 = local_40->elemsize;
          pvVar5 = local_40->data;
          sVar8 = top_blob->cstep;
          sVar9 = top_blob->elemsize;
          pvVar7 = top_blob->data;
          if ((this->super_Dequantize).scale_data_size < 2) {
            local_88.data = (this->super_Dequantize).scale_data.data;
            local_88.refcount = (this->super_Dequantize).scale_data.refcount;
            local_88.elemsize = (this->super_Dequantize).scale_data.elemsize;
            local_88.elempack = (this->super_Dequantize).scale_data.elempack;
            local_88.allocator = (this->super_Dequantize).scale_data.allocator;
            local_88.dims = (this->super_Dequantize).scale_data.dims;
            local_88.w = (this->super_Dequantize).scale_data.w;
            local_88.h = (this->super_Dequantize).scale_data.h;
            local_88.d = (this->super_Dequantize).scale_data.d;
            local_88.c = (this->super_Dequantize).scale_data.c;
            local_88.cstep = (this->super_Dequantize).scale_data.cstep;
            if (local_88.refcount != (int *)0x0) {
              LOCK();
              *local_88.refcount = *local_88.refcount + 1;
              UNLOCK();
            }
          }
          else {
            local_88.elemsize = (this->super_Dequantize).scale_data.elemsize;
            local_88.data =
                 (void *)(local_88.elemsize * lVar11 +
                         (long)(this->super_Dequantize).scale_data.data);
            local_88.elempack = (this->super_Dequantize).scale_data.elempack;
            local_88.allocator = (this->super_Dequantize).scale_data.allocator;
            local_88.refcount = (int *)0x0;
            local_88.c = 1;
            local_88.w = elempack;
            local_88.dims = 1;
            local_88.h = 1;
            local_88.d = 1;
            local_88.cstep = sVar10;
          }
          if ((this->super_Dequantize).bias_data_size < 2) {
            local_d0.data = (this->super_Dequantize).bias_data.data;
            piVar12 = (this->super_Dequantize).bias_data.refcount;
            local_d0.elemsize = (this->super_Dequantize).bias_data.elemsize;
            local_d0.elempack = (this->super_Dequantize).bias_data.elempack;
            local_d0.allocator = (this->super_Dequantize).bias_data.allocator;
            local_d0.dims = (this->super_Dequantize).bias_data.dims;
            local_d0.w = (this->super_Dequantize).bias_data.w;
            local_d0.h = (this->super_Dequantize).bias_data.h;
            local_d0.d = (this->super_Dequantize).bias_data.d;
            local_d0.c = (this->super_Dequantize).bias_data.c;
            local_d0.cstep = (this->super_Dequantize).bias_data.cstep;
            local_d0.refcount = piVar12;
            if (piVar12 == (int *)0x0) goto LAB_003fc9be;
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          else {
            local_d0.elemsize = (this->super_Dequantize).bias_data.elemsize;
            local_d0.data =
                 (void *)(local_d0.elemsize * lVar11 + (long)(this->super_Dequantize).bias_data.data
                         );
            local_d0.elempack = (this->super_Dequantize).bias_data.elempack;
            local_d0.allocator = (this->super_Dequantize).bias_data.allocator;
            local_d0.refcount = (int *)0x0;
            local_d0.c = 1;
            local_d0.w = elempack;
            local_d0.dims = 1;
            local_d0.h = 1;
            local_d0.d = 1;
            local_d0.cstep = sVar10;
LAB_003fc9be:
            piVar12 = (int *)0x0;
          }
          dequantize((int *)(sVar4 * uVar15 * sVar6 + (long)pvVar5),
                     (float *)(sVar8 * uVar15 * sVar9 + (long)pvVar7),&local_88,&local_d0,
                     uVar2 * elemcount,elempack);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_d0.allocator == (Allocator *)0x0) {
                free(local_d0.data);
              }
              else {
                (*(local_d0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + -1;
            UNLOCK();
            if (*local_88.refcount == 0) {
              if (local_88.allocator == (Allocator *)0x0) {
                free(local_88.data);
              }
              else {
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar11 = lVar11 + sVar10;
        }
      }
      else if (iVar1 == 2) {
        local_d8 = 0;
        if ((int)uVar2 < 1) {
          uVar15 = 0;
        }
        lVar11 = 0;
        for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          iVar1 = local_40->w;
          sVar4 = local_40->elemsize;
          pvVar5 = local_40->data;
          iVar16 = top_blob->w;
          sVar6 = top_blob->elemsize;
          pvVar7 = top_blob->data;
          if ((this->super_Dequantize).scale_data_size < 2) {
            local_88.data = (this->super_Dequantize).scale_data.data;
            local_88.refcount = (this->super_Dequantize).scale_data.refcount;
            local_88.elemsize = (this->super_Dequantize).scale_data.elemsize;
            local_88.elempack = (this->super_Dequantize).scale_data.elempack;
            local_88.allocator = (this->super_Dequantize).scale_data.allocator;
            local_88.dims = (this->super_Dequantize).scale_data.dims;
            local_88.w = (this->super_Dequantize).scale_data.w;
            local_88.h = (this->super_Dequantize).scale_data.h;
            local_88.d = (this->super_Dequantize).scale_data.d;
            local_88.c = (this->super_Dequantize).scale_data.c;
            local_88.cstep = (this->super_Dequantize).scale_data.cstep;
            if (local_88.refcount != (int *)0x0) {
              LOCK();
              *local_88.refcount = *local_88.refcount + 1;
              UNLOCK();
            }
          }
          else {
            local_88.elemsize = (this->super_Dequantize).scale_data.elemsize;
            local_88.data =
                 (void *)(local_88.elemsize * lVar11 +
                         (long)(this->super_Dequantize).scale_data.data);
            local_88.elempack = (this->super_Dequantize).scale_data.elempack;
            local_88.allocator = (this->super_Dequantize).scale_data.allocator;
            local_88.refcount = (int *)0x0;
            local_88.c = 1;
            local_88.w = elempack;
            local_88.dims = 1;
            local_88.h = 1;
            local_88.d = 1;
            local_88.cstep = sVar10;
          }
          if ((this->super_Dequantize).bias_data_size < 2) {
            local_d0.data = (this->super_Dequantize).bias_data.data;
            piVar12 = (this->super_Dequantize).bias_data.refcount;
            local_d0.elemsize = (this->super_Dequantize).bias_data.elemsize;
            local_d0.elempack = (this->super_Dequantize).bias_data.elempack;
            local_d0.allocator = (this->super_Dequantize).bias_data.allocator;
            local_d0.dims = (this->super_Dequantize).bias_data.dims;
            local_d0.w = (this->super_Dequantize).bias_data.w;
            local_d0.h = (this->super_Dequantize).bias_data.h;
            local_d0.d = (this->super_Dequantize).bias_data.d;
            local_d0.c = (this->super_Dequantize).bias_data.c;
            local_d0.cstep = (this->super_Dequantize).bias_data.cstep;
            local_d0.refcount = piVar12;
            if (piVar12 == (int *)0x0) goto LAB_003fc6fc;
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          else {
            local_d0.elemsize = (this->super_Dequantize).bias_data.elemsize;
            local_d0.data =
                 (void *)(local_d0.elemsize * lVar11 + (long)(this->super_Dequantize).bias_data.data
                         );
            local_d0.elempack = (this->super_Dequantize).bias_data.elempack;
            local_d0.allocator = (this->super_Dequantize).bias_data.allocator;
            local_d0.refcount = (int *)0x0;
            local_d0.c = 1;
            local_d0.w = elempack;
            local_d0.dims = 1;
            local_d0.h = 1;
            local_d0.d = 1;
            local_d0.cstep = sVar10;
LAB_003fc6fc:
            piVar12 = (int *)0x0;
          }
          dequantize((int *)((long)iVar1 * uVar14 * sVar4 + (long)pvVar5),
                     (float *)((long)iVar16 * uVar14 * sVar6 + (long)pvVar7),&local_88,&local_d0,
                     elemcount,elempack);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_d0.allocator == (Allocator *)0x0) {
                free(local_d0.data);
              }
              else {
                (*(local_d0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + -1;
            UNLOCK();
            if (*local_88.refcount == 0) {
              if (local_88.allocator == (Allocator *)0x0) {
                free(local_88.data);
              }
              else {
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar11 = lVar11 + sVar10;
        }
      }
      else {
        local_d8 = 0;
        if (iVar1 == 1) {
          uVar15 = (long)elemcount / (long)opt->num_threads;
          if ((int)uVar15 < 2) {
            uVar15 = 1;
          }
          iVar1 = (int)uVar15;
          uVar14 = (long)(elemcount + iVar1 + -1) / (long)iVar1;
          uVar13 = uVar14 & 0xffffffff;
          local_38 = &(this->super_Dequantize).scale_data;
          local_d8 = 0;
          if ((int)uVar14 < 1) {
            uVar13 = 0;
          }
          lVar11 = 0;
          while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
            iVar16 = elemcount;
            if (iVar1 < elemcount) {
              iVar16 = iVar1;
            }
            elemcount = -(iVar1 - elemcount);
            dequantize((int *)((long)local_40->data + lVar11),
                       (float *)((long)top_blob->data + lVar11),local_38,
                       &(this->super_Dequantize).bias_data,iVar16 * elempack,1);
            lVar11 = lVar11 + sVar10 * (uVar15 & 0xffffffff) * 4;
          }
        }
      }
    }
  }
  return local_d8;
}

Assistant:

int Dequantize_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            float* ptr = (float*)top_blob + i * elempack;

            // assert scale_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            dequantize(intptr, ptr, scale_data, bias_data, size, 1);
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_i, bias_data_i, w, elempack);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_q, bias_data_q, w * h, elempack);
        }
    }

    return 0;
}